

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O0

LogLevels helics::logLevelFromString(string_view level)

{
  string_view V;
  bool bVar1;
  int iVar2;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  this;
  pointer pvVar3;
  const_iterator res;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff90 [16];
  size_type in_stack_ffffffffffffffa8;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
  local_20 [3];
  LogLevels local_4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            (in_stack_ffffffffffffffc0,
             (basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
             (allocator<char> *)in_stack_ffffffffffffffb0);
  local_20[0]._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(in_stack_ffffffffffffff78,(key_type *)0x77d167);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_20[0]._M_cur
            );
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffbf);
  this._M_cur = (__node_type *)
                CLI::std::
                unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                ::end(in_stack_ffffffffffffff78);
  bVar1 = CLI::std::__detail::operator==
                    (local_20,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
                               *)&stack0xffffffffffffffa0);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    iVar2 = CLI::std::basic_string_view<char,_std::char_traits<char>_>::compare
                      (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,(size_type)this._M_cur,
                       in_stack_ffffffffffffff90._8_8_);
    if (iVar2 == 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::substr
                ((basic_string_view<char,_std::char_traits<char>_> *)this._M_cur,
                 in_stack_ffffffffffffff90._8_8_,in_stack_ffffffffffffff90._0_8_);
      V._M_str = in_stack_ffffffffffffffc8;
      V._M_len = (size_t)in_stack_ffffffffffffffc0;
      local_4 = gmlc::utilities::numeric_conversion<int>(V,in_stack_ffffffffffffffbc);
    }
    else {
      local_4 = 0xfff0bdc1;
    }
  }
  else {
    pvVar3 = CLI::std::__detail::
             _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
             ::operator->((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_false,_true>
                           *)0x77d1be);
    local_4 = pvVar3->second;
  }
  return local_4;
}

Assistant:

LogLevels logLevelFromString(std::string_view level)
{
    auto res = gLogLevelMap.find(std::string(level));
    if (res != gLogLevelMap.end()) {
        return static_cast<LogLevels>(res->second);
    }
    if (level.compare(0, 9, "loglevel_") == 0) {
        return static_cast<LogLevels>(
            gmlc::utilities::numeric_conversion<int>(level.substr(9), -999999));
    } else {
        return static_cast<LogLevels>(-999999);
    }
}